

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

whisper_context *
whisper_init_with_params(whisper_model_loader *loader,whisper_context_params params)

{
  whisper_context_params params_00;
  whisper_state *pwVar1;
  undefined8 in_RDI;
  whisper_context *ctx;
  whisper_context *in_stack_00001598;
  undefined8 in_stack_ffffffffffffffb8;
  whisper_context *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  whisper_model_loader *in_stack_ffffffffffffffd8;
  whisper_context *local_8;
  
  memcpy(&stack0xffffffffffffffb8,&stack0x00000008,0x30);
  params_00.dtw_token_timestamps = (bool)(char)in_stack_ffffffffffffffb8;
  params_00._9_3_ = (int3)((ulong)in_stack_ffffffffffffffb8 >> 8);
  params_00.dtw_aheads_preset = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  params_00.use_gpu = (bool)(char)in_RDI;
  params_00.flash_attn = (bool)(char)((ulong)in_RDI >> 8);
  params_00._2_2_ = (short)((ulong)in_RDI >> 0x10);
  params_00.gpu_device = (int)((ulong)in_RDI >> 0x20);
  params_00._16_8_ = in_stack_ffffffffffffffc0;
  params_00.dtw_aheads.n_heads = in_stack_ffffffffffffffc8;
  params_00.dtw_aheads.heads = (whisper_ahead *)in_stack_ffffffffffffffd0;
  params_00.dtw_mem_size = (size_t)in_stack_ffffffffffffffd8;
  local_8 = whisper_init_with_params_no_state(in_stack_ffffffffffffffd8,params_00);
  if (local_8 == (whisper_context *)0x0) {
    local_8 = (whisper_context *)0x0;
  }
  else {
    pwVar1 = whisper_init_state(in_stack_00001598);
    local_8->state = pwVar1;
    if (local_8->state == (whisper_state *)0x0) {
      whisper_free(in_stack_ffffffffffffffc0);
      local_8 = (whisper_context *)0x0;
    }
  }
  return local_8;
}

Assistant:

struct whisper_context * whisper_init_with_params(struct whisper_model_loader * loader, struct whisper_context_params params) {
    whisper_context * ctx = whisper_init_with_params_no_state(loader, params);
    if (!ctx) {
        return nullptr;
    }

    ctx->state = whisper_init_state(ctx);
    if (!ctx->state) {
        whisper_free(ctx);
        return nullptr;
    }

    return ctx;
}